

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

uint __thiscall Imath_3_2::Box<Imath_3_2::Vec4<int>_>::majorAxis(Box<Imath_3_2::Vec4<int>_> *this)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint i;
  Vec4<int> s;
  uint major;
  uint local_20;
  Box<Imath_3_2::Vec4<int>_> *in_stack_ffffffffffffffe8;
  uint local_c;
  
  local_c = 0;
  size(in_stack_ffffffffffffffe8);
  local_20 = 1;
  while( true ) {
    uVar2 = Vec4<int>::dimensions();
    if (uVar2 <= local_20) break;
    piVar3 = Vec4<int>::operator[]((Vec4<int> *)&stack0xffffffffffffffe4,local_20);
    iVar1 = *piVar3;
    piVar3 = Vec4<int>::operator[]((Vec4<int> *)&stack0xffffffffffffffe4,local_c);
    if (*piVar3 < iVar1) {
      local_c = local_20;
    }
    local_20 = local_20 + 1;
  }
  return local_c;
}

Assistant:

unsigned int
Box<V>::majorAxis () const IMATH_NOEXCEPT
{
    unsigned int major = 0;
    V            s     = size ();

    for (unsigned int i = 1; i < min.dimensions (); i++)
    {
        if (s[i] > s[major]) major = i;
    }

    return major;
}